

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassPoint * ecc_weierstrass_add(WeierstrassPoint *P,WeierstrassPoint *Q)

{
  uint uVar1;
  mp_int *local_58;
  mp_int *lambda_d;
  mp_int *lambda_n;
  mp_int *denom;
  mp_int *Qx;
  mp_int *Py;
  mp_int *Px;
  WeierstrassPoint *S;
  WeierstrassCurve *wc;
  WeierstrassPoint *Q_local;
  WeierstrassPoint *P_local;
  
  S = (WeierstrassPoint *)P->wc;
  wc = (WeierstrassCurve *)Q;
  Q_local = P;
  if (Q->wc != (WeierstrassCurve *)S) {
    __assert_fail("Q->wc == wc",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                  ,0x12f,
                  "WeierstrassPoint *ecc_weierstrass_add(WeierstrassPoint *, WeierstrassPoint *)");
  }
  Px = (mp_int *)ecc_weierstrass_point_new_empty((WeierstrassCurve *)S);
  ecc_weierstrass_add_prologue
            (Q_local,(WeierstrassPoint *)wc,&Py,&Qx,&denom,&lambda_n,&lambda_d,&local_58);
  uVar1 = mp_eq_integer(lambda_d,0);
  if (uVar1 == 0) {
    ecc_weierstrass_epilogue(Py,denom,Qx,lambda_n,lambda_d,local_58,(WeierstrassPoint *)Px);
    mp_free(Py);
    mp_free(Qx);
    mp_free(denom);
    mp_free(lambda_n);
    mp_free(lambda_d);
    mp_free(local_58);
    return (WeierstrassPoint *)Px;
  }
  __assert_fail("!mp_eq_integer(lambda_n, 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x13b,
                "WeierstrassPoint *ecc_weierstrass_add(WeierstrassPoint *, WeierstrassPoint *)");
}

Assistant:

WeierstrassPoint *ecc_weierstrass_add(WeierstrassPoint *P, WeierstrassPoint *Q)
{
    WeierstrassCurve *wc = P->wc;
    assert(Q->wc == wc);

    WeierstrassPoint *S = ecc_weierstrass_point_new_empty(wc);

    mp_int *Px, *Py, *Qx, *denom, *lambda_n, *lambda_d;
    ecc_weierstrass_add_prologue(
        P, Q, &Px, &Py, &Qx, &denom, &lambda_n, &lambda_d);

    /* Never expect to have received two mutually inverse inputs, or
     * two identical ones (which would make this a doubling). In other
     * words, the two input x-coordinates (after putting over a common
     * denominator) should never have been equal. */
    assert(!mp_eq_integer(lambda_n, 0));

    /* Now go to the common epilogue code. */
    ecc_weierstrass_epilogue(Px, Qx, Py, denom, lambda_n, lambda_d, S);

    mp_free(Px);
    mp_free(Py);
    mp_free(Qx);
    mp_free(denom);
    mp_free(lambda_n);
    mp_free(lambda_d);

    return S;
}